

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.hpp
# Opt level: O1

string_view __thiscall
cinatra::get_local_time_str<8ul,32ul>(cinatra *this,char (*buf) [32],time_t t,string_view format)

{
  byte bVar1;
  undefined2 *puVar2;
  tm *ptVar3;
  size_t sVar4;
  cinatra *pcVar5;
  int iVar6;
  cinatra cVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  string_view sVar11;
  char (*local_38) [32];
  
  sVar4 = format._M_len;
  local_38 = buf;
  ptVar3 = gmtime((time_t *)&local_38);
  pcVar5 = this;
  if (t != 0) {
    uVar8 = 0;
    iVar6 = 0;
    do {
      if (*(char *)(sVar4 + uVar8) == '%') {
        uVar8 = (long)iVar6 + 2;
        cVar7 = (cinatra)0x30;
        if (uVar8 < (ulong)t) {
          cVar7 = *(cinatra *)(sVar4 + uVar8);
        }
        bVar1 = *(byte *)(sVar4 + 1 + (long)iVar6);
        iVar6 = iVar6 + 1;
        if (bVar1 < 0x61) {
          if (bVar1 < 0x53) {
            if (bVar1 == 0x48) {
              lVar9 = 1;
              iVar10 = ptVar3->tm_hour + 8;
              do {
                pcVar5[lVar9] = *(cinatra *)(digits + iVar10 % 10);
                lVar9 = lVar9 + -1;
                iVar10 = iVar10 / 10;
              } while (lVar9 == 0);
            }
            else {
              if (bVar1 != 0x4d) goto LAB_001167d5;
              lVar9 = 1;
              iVar10 = ptVar3->tm_min;
              do {
                pcVar5[lVar9] = *(cinatra *)(digits + iVar10 % 10);
                lVar9 = lVar9 + -1;
                iVar10 = iVar10 / 10;
              } while (lVar9 == 0);
            }
          }
          else {
            if (bVar1 != 0x53) {
              if (bVar1 == 0x59) {
                lVar9 = 4;
                iVar10 = ptVar3->tm_year + 0x76c;
                do {
                  pcVar5[lVar9 + -1] = *(cinatra *)(digits + iVar10 % 10);
                  lVar9 = lVar9 + -1;
                  iVar10 = iVar10 / 10;
                } while (lVar9 != 0);
                pcVar5[4] = cVar7;
                goto LAB_00116747;
              }
              goto LAB_001167d5;
            }
            lVar9 = 1;
            iVar10 = ptVar3->tm_sec;
            do {
              pcVar5[lVar9] = *(cinatra *)(digits + iVar10 % 10);
              lVar9 = lVar9 + -1;
              iVar10 = iVar10 / 10;
            } while (lVar9 == 0);
          }
        }
        else {
          if (bVar1 < 100) {
            if (bVar1 == 0x61) {
              puVar2 = *(undefined2 **)(WDAY + (long)ptVar3->tm_wday * 0x10 + 8);
              pcVar5[2] = *(cinatra *)(puVar2 + 1);
              *(undefined2 *)pcVar5 = *puVar2;
              pcVar5[3] = cVar7;
              pcVar5[4] = (cinatra)0x20;
LAB_00116747:
              pcVar5 = pcVar5 + 5;
            }
            else if (bVar1 == 0x62) {
              puVar2 = *(undefined2 **)(YMON + (long)ptVar3->tm_mon * 0x10 + 8);
              pcVar5[2] = *(cinatra *)(puVar2 + 1);
              *(undefined2 *)pcVar5 = *puVar2;
              pcVar5[3] = cVar7;
              pcVar5 = pcVar5 + 4;
            }
            goto LAB_001167d5;
          }
          if (bVar1 == 100) {
            lVar9 = 1;
            iVar10 = ptVar3->tm_mday;
            do {
              pcVar5[lVar9] = *(cinatra *)(digits + iVar10 % 10);
              lVar9 = lVar9 + -1;
              iVar10 = iVar10 / 10;
            } while (lVar9 == 0);
          }
          else {
            if (bVar1 != 0x6d) goto LAB_001167d5;
            lVar9 = 1;
            iVar10 = ptVar3->tm_mon + 1;
            do {
              pcVar5[lVar9] = *(cinatra *)(digits + iVar10 % 10);
              lVar9 = lVar9 + -1;
              iVar10 = iVar10 / 10;
            } while (lVar9 == 0);
          }
        }
        pcVar5[2] = cVar7;
        pcVar5 = pcVar5 + 3;
      }
LAB_001167d5:
      iVar6 = iVar6 + 1;
      uVar8 = (ulong)iVar6;
    } while (uVar8 < (ulong)t);
  }
  sVar11._M_len = pcVar5 + ~(ulong)this;
  sVar11._M_str = (char *)this;
  return sVar11;
}

Assistant:

inline std::string_view get_local_time_str(char (&buf)[N], std::time_t t,
                                           std::string_view format) {
  static_assert(N >= 20, "wrong buf");
  struct tm *loc_time = gmtime(&t);

  char *p = buf;

  for (int i = 0; i < format.size(); ++i) {
    if (format[i] == '%') {
      char c = i + 2 < format.size() ? format[i + 2] : '0';
      i++;
      if (format[i] == 'Y') {
        to_year(p, loc_time->tm_year + 1900, c);
        p += 5;
      }
      else if (format[i] == 'm') {
        to_month(p, loc_time->tm_mon + 1, c);
        p += 3;
      }
      else if (format[i] == 'd') {
        to_day(p, loc_time->tm_mday, c);
        p += 3;
      }
      else if (format[i] == 'H') {
        to_hour(p, loc_time->tm_hour + Hour, c);
        p += 3;
      }
      else if (format[i] == 'M') {
        to_min(p, loc_time->tm_min, c);
        p += 3;
      }
      else if (format[i] == 'S') {
        to_sec(p, loc_time->tm_sec, c);
        p += 3;
      }
      else if (format[i] == 'a') {
        memcpy(p, WDAY[loc_time->tm_wday].data(), 3);
        p += 3;
        *p++ = c;
        *p++ = ' ';
      }
      else if (format[i] == 'b') {
        memcpy(p, YMON[loc_time->tm_mon].data(), 3);
        p += 3;
        *p = c;
        p += 1;
      }
    }
  }

  size_t n = p - buf - 1;

  return {buf, n};
}